

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void __thiscall
sisl::array_n<char,_3,_std::allocator<char>_>::_alloc
          (array_n<char,_3,_std::allocator<char>_> *this,uint n)

{
  char *pcVar1;
  pointer pcVar2;
  ulong __n;
  ulong uVar3;
  
  if (n == 0) {
    pcVar2 = (pointer)0x0;
  }
  else {
    __n = (ulong)n;
    pcVar1 = __gnu_cxx::new_allocator<char>::allocate((new_allocator<char> *)this,__n,(void *)0x0);
    this->first = pcVar1;
    for (uVar3 = 0; pcVar2 = this->first, __n != uVar3; uVar3 = uVar3 + 1) {
      pcVar2[uVar3] = '\0';
    }
    this->last = pcVar2 + __n;
  }
  this->_array = pcVar2;
  return;
}

Assistant:

void _alloc(unsigned int n) {
            size_type i;
            if(n == 0) {
                this->_array = nullptr;
                return;
            }

            this->first = Allocator::allocate(n);
            try {
                for (i = 0; i < n; ++i) {
                    Allocator::construct(first + i, T());
                }
            }catch(...) {
                for(size_type j = 0; j < i; ++j) {
                     Allocator::destroy(first + j);
                }
                Allocator::deallocate(first, n);
                throw;
            }
            last = first + i;
            this->_array = static_cast<T *>(first);
        }